

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luartmidi.cpp
# Opt level: O3

int luaopen_luartmidi(lua_State *L)

{
  lua_createtable(L,0,4);
  lua_pushlstring(L,"sleep",5);
  lua_pushcclosure(L,luaopen_luartmidi::anon_class_1_0_00000001::__invoke,0);
  lua_rawset(L,0xfffffffd);
  lua_pushlstring(L,"RtMidi",6);
  luaopen_luartmidi_rtmidi(L);
  lua_rawset(L,0xfffffffd);
  lua_pushlstring(L,"RtMidiIn",8);
  luaopen_luartmidi_rtmidiin(L);
  lua_rawset(L,0xfffffffd);
  lua_pushlstring(L,"RtMidiOut",9);
  luaopen_luartmidi_rtmidiout(L);
  lua_rawset(L,0xfffffffd);
  lua_pushlstring(L,"RtMidiError",0xb);
  luaopen_luartmidi_rtmidierror(L);
  lua_rawset(L,0xfffffffd);
  return 1;
}

Assistant:

LUA_RTMIDI_API int luaopen_luartmidi(lua_State *L) {
	lua_createtable(L, 0, 4);

	lua_pushliteral(L, "sleep");
	lua_pushcfunction(L, [] (lua_State *L) {
		auto s = std::chrono::duration<lua_Number>(luaL_checknumber(L, 1));
		std::this_thread::sleep_for(s);
		return 0;
	});
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidi");
	luaopen_luartmidi_rtmidi(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiIn");
	luaopen_luartmidi_rtmidiin(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiOut");
	luaopen_luartmidi_rtmidiout(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiError");
	luaopen_luartmidi_rtmidierror(L);
	lua_rawset(L, -3);

	return 1;
}